

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLbitset.c
# Opt level: O1

uint RDL_bitset_compressed(uchar **compressed,char *edges,uint size)

{
  uchar *__s;
  ulong uVar1;
  uint uVar2;
  
  uVar2 = ((size >> 3) + 1) - (uint)((size & 7) == 0);
  __s = (uchar *)malloc((ulong)uVar2);
  *compressed = __s;
  memset(__s,0,(ulong)uVar2);
  if (size != 0) {
    uVar1 = 0;
    do {
      if (edges[uVar1] != '\0') {
        (*compressed)[uVar1 >> 3 & 0x1fffffff] =
             (*compressed)[uVar1 >> 3 & 0x1fffffff] | '\x01' << ((byte)uVar1 & 7);
      }
      uVar1 = uVar1 + 1;
    } while (size != uVar1);
  }
  return uVar2;
}

Assistant:

unsigned RDL_bitset_compressed(unsigned char** compressed, const char* edges, unsigned size)
{
  unsigned new_size, i;

  new_size = RDL_bitset_init(compressed, size);

  for (i = 0; i < size; ++i) {
    if (edges[i]) {
      RDL_bitset_set(*compressed, i);
    }
  }

  return new_size;
}